

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<
          (AssertionResult *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  Message *a_message;
  Message *in_stack_ffffffffffffffd0;
  Message local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  AssertionResult *this_local;
  
  local_18 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  Message::Message(in_stack_ffffffffffffffd0);
  a_message = Message::operator<<(&local_20,local_18);
  AppendMessage(this,a_message);
  Message::~Message((Message *)0x12f130);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }